

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXProperties.h
# Opt level: O0

aiVector3t<float>
Assimp::FBX::PropertyGet<aiVector3t<float>>
          (PropertyTable *in,string *name,bool *result,bool useTemplate)

{
  aiVector3t<float> aVar1;
  PropertyTable *this;
  TypedProperty<aiVector3t<float>_> *this_00;
  aiVector3t<float> *paVar2;
  TypedProperty<aiVector3t<float>_> *tprop;
  PropertyTable *templ;
  Property *prop;
  bool useTemplate_local;
  bool *result_local;
  string *name_local;
  PropertyTable *in_local;
  undefined4 uStack_10;
  float local_c;
  
  templ = (PropertyTable *)PropertyTable::Get(in,name);
  if (templ == (PropertyTable *)0x0) {
    if (!useTemplate) {
      *result = false;
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)((long)&in_local + 4));
      goto LAB_009800f7;
    }
    this = PropertyTable::TemplateProps(in);
    if (this == (PropertyTable *)0x0) {
      *result = false;
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)((long)&in_local + 4));
      goto LAB_009800f7;
    }
    templ = (PropertyTable *)PropertyTable::Get(this,name);
    if (templ == (PropertyTable *)0x0) {
      *result = false;
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)((long)&in_local + 4));
      goto LAB_009800f7;
    }
  }
  this_00 = Property::As<Assimp::FBX::TypedProperty<aiVector3t<float>>>((Property *)templ);
  if (this_00 == (TypedProperty<aiVector3t<float>_> *)0x0) {
    *result = false;
    aiVector3t<float>::aiVector3t((aiVector3t<float> *)((long)&in_local + 4));
  }
  else {
    *result = true;
    paVar2 = TypedProperty<aiVector3t<float>_>::Value(this_00);
    in_local._4_4_ = paVar2->x;
    uStack_10 = paVar2->y;
    local_c = paVar2->z;
  }
LAB_009800f7:
  aVar1.z = local_c;
  aVar1.x = (float)in_local._4_4_;
  aVar1.y = (float)uStack_10;
  return aVar1;
}

Assistant:

inline 
T PropertyGet(const PropertyTable& in, const std::string& name, bool& result, bool useTemplate=false ) {
    const Property* prop = in.Get(name);
    if( nullptr == prop) {
        if ( ! useTemplate ) {
            result = false;
            return T();
        }
        const PropertyTable* templ = in.TemplateProps();
        if ( nullptr == templ ) {
            result = false;
            return T();
        }
        prop = templ->Get(name);
        if ( nullptr == prop ) {
            result = false;
            return T();
        }
    }

    // strong typing, no need to be lenient
    const TypedProperty<T>* const tprop = prop->As< TypedProperty<T> >();
    if( nullptr == tprop) {
        result = false;
        return T();
    }

    result = true;
    return tprop->Value();
}